

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface.cc
# Opt level: O1

void __thiscall
kratos::InterfaceModPortDefinition::set_output(InterfaceModPortDefinition *this,string *name)

{
  element_type *peVar1;
  int iVar2;
  UserException *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  format_args args;
  pointer local_88;
  size_type sStack_80;
  pointer local_78;
  size_type sStack_70;
  undefined1 local_68 [4];
  int local_64;
  void *local_60;
  long local_50;
  string local_40;
  
  iVar2 = (**(((this->def_).
               super___shared_ptr<kratos::InterfaceDefinition,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             super_IDefinition)._vptr_IDefinition)();
  if ((char)iVar2 == '\0') {
    peVar1 = (this->def_).
             super___shared_ptr<kratos::InterfaceDefinition,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    iVar2 = (*(peVar1->super_IDefinition)._vptr_IDefinition[1])(peVar1,name);
    if ((char)iVar2 != '\0') {
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_emplace_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&this->outputs_,name);
      return;
    }
  }
  else {
    peVar1 = (this->def_).
             super___shared_ptr<kratos::InterfaceDefinition,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*(peVar1->super_IDefinition)._vptr_IDefinition[2])(local_68,peVar1,name);
    if (local_64 != 1) {
      this_00 = (UserException *)__cxa_allocate_exception(0x10);
      local_88 = (name->_M_dataplus)._M_p;
      sStack_80 = name->_M_string_length;
      local_78 = (this->name_)._M_dataplus._M_p;
      sStack_70 = (this->name_)._M_string_length;
      format_str.size_ = 0xdd;
      format_str.data_ = (char *)0x3a;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.args_ = in_R9.args_;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)&local_88;
      fmt::v7::detail::vformat_abi_cxx11_
                (&local_40,(detail *)"{0} is not declared as an output but is used as one in {1}",
                 format_str,args);
      UserException::UserException(this_00,&local_40);
      __cxa_throw(this_00,&UserException::typeinfo,std::runtime_error::~runtime_error);
    }
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_emplace_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&this->outputs_,name);
    if (local_60 != (void *)0x0) {
      operator_delete(local_60,local_50 - (long)local_60);
    }
  }
  return;
}

Assistant:

void InterfaceModPortDefinition::set_output(const std::string& name) {
    if (def_->has_port(name)) {
        // this is a port
        auto const& port_def = def_->port(name);
        auto dir = std::get<2>(port_def);
        if (dir != PortDirection::Out) {
            throw UserException(::format(
                "{0} is not declared as an output but is used as one in {1}", name, name_));
        }
        outputs_.emplace(name);
    } else if (def_->has_var(name)) {
        // this is a variable
        outputs_.emplace(name);
    }
}